

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::buildSimple(HFactor *this)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  reference pvVar7;
  reference pvVar8;
  size_type sVar9;
  size_type sVar10;
  size_type sVar11;
  size_type sVar12;
  long in_RDI;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double value;
  HighsInt iRow_6;
  HighsInt k_5;
  HighsInt iCol_2;
  HighsInt i_1;
  HighsInt MCcountX;
  HighsInt mc_dim;
  HighsInt count_2;
  HighsInt iRow_5;
  HighsInt mr_countX;
  HighsInt iRow_4;
  HighsInt k_4;
  HighsInt k_3;
  HighsInt iRow_2;
  HighsInt iRow_3;
  HighsInt k_2;
  HighsInt p1;
  HighsInt p0;
  HighsInt section;
  double pivot_multiplier;
  HighsInt iRow_1;
  HighsInt k_1;
  HighsInt count_1;
  HighsInt found_row_singleton;
  HighsInt pivot_k;
  HighsInt end;
  HighsInt start_1;
  HighsInt iCol_1;
  HighsInt i;
  HighsInt nworkLast;
  double t2_store_p;
  double t2_store_u;
  double t2_store_l;
  double t2_search;
  HighsInt k;
  bool ok_unit_col;
  HighsInt count;
  HighsInt start;
  HighsInt lc_iRow;
  int8_t pivot_type;
  HighsInt iRow;
  HighsInt iMat;
  HighsInt iCol;
  HighsInt iwork_dim;
  HighsInt BcountX;
  bool report_anything;
  bool report_markowitz;
  bool report_singletons;
  bool report_unit;
  HighsInt permute_dim;
  HighsInt progress_frequency;
  bool progress_report;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  value_type vVar18;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  HighsInt count_00;
  int in_stack_fffffffffffffdbc;
  HighsInt index;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 uVar20;
  size_type in_stack_fffffffffffffdc8;
  double dVar21;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdd0;
  HFactor *this_00;
  int local_1b0;
  int local_12c;
  int local_124;
  int local_120;
  int local_108;
  int local_104;
  int local_ec;
  int local_e8;
  int local_c8;
  int local_bc;
  int local_ac;
  int local_a8;
  int local_a0;
  int local_90;
  double local_70;
  int local_54;
  int local_3c;
  int local_34;
  int local_20;
  
  luClear((HFactor *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             (value_type_conflict2 *)0x7c9bcf);
  local_20 = 0;
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7c9c0e);
  std::fill_n<int*,int,int>
            ((int *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdbc,
             (int *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  *(undefined4 *)(in_RDI + 0x1a8) = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             (value_type_conflict2 *)0x7c9cb6);
  for (local_34 = 0; local_34 < *(int *)(in_RDI + 0xd0); local_34 = local_34 + 1) {
    iVar2 = *(int *)(*(long *)(in_RDI + 0x100) + (long)local_34 * 4);
    local_3c = -1;
    if (iVar2 < *(int *)(in_RDI + 0xcc)) {
      iVar5 = *(int *)(*(long *)(in_RDI + 0xe8) + (long)iVar2 * 4);
      iVar6 = *(int *)(*(long *)(in_RDI + 0xe8) + (long)(iVar2 + 1) * 4) - iVar5;
      bVar13 = false;
      if (iVar6 == 1) {
        dVar21 = *(double *)(*(long *)(in_RDI + 0xf8) + (long)iVar5 * 8);
        bVar13 = false;
        if ((dVar21 == 1.0) && (!NAN(dVar21))) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),
                              (long)*(int *)(*(long *)(in_RDI + 0xf0) + (long)iVar5 * 4));
          bVar13 = -1 < *pvVar7;
        }
      }
      local_54 = iVar5;
      if (bVar13) {
        iVar5 = *(int *)(*(long *)(in_RDI + 0xf0) + (long)iVar5 * 4);
      }
      else {
        for (; local_54 < iVar5 + iVar6; local_54 = local_54 + 1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),
                              (long)*(int *)(*(long *)(in_RDI + 0xf0) + (long)local_54 * 4));
          *pvVar7 = *pvVar7 + 1;
          vVar18 = *(value_type *)(*(long *)(in_RDI + 0xf0) + (long)local_54 * 4);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x210),(long)local_20);
          *pvVar7 = vVar18;
          vVar1 = *(value_type *)(*(long *)(in_RDI + 0xf8) + (long)local_54 * 8);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x228),
                              (long)local_20);
          *pvVar8 = vVar1;
          local_20 = local_20 + 1;
        }
        iVar5 = *(int *)(in_RDI + 0x1a8);
        *(int *)(in_RDI + 0x1a8) = iVar5 + 1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1b0),(long)iVar5);
        *pvVar7 = local_34;
        iVar5 = local_3c;
      }
    }
    else {
      iVar5 = iVar2 - *(int *)(in_RDI + 0xcc);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),(long)iVar5);
      if (*pvVar7 < 0) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),(long)iVar5);
        *pvVar7 = *pvVar7 + 1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x210),(long)local_20);
        *pvVar7 = iVar5;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x228),
                            (long)local_20);
        *pvVar8 = 1.0;
        iVar5 = *(int *)(in_RDI + 0x1a8);
        *(int *)(in_RDI + 0x1a8) = iVar5 + 1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1b0),(long)iVar5);
        *pvVar7 = local_34;
        iVar5 = local_3c;
        local_20 = local_20 + 1;
      }
    }
    local_3c = iVar5;
    if (-1 < local_3c) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x240),(long)local_34);
      *pvVar7 = local_3c;
      std::vector<int,_std::allocator<int>_>::size
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      std::vector<int,_std::allocator<int>_>::size
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      iVar5 = *(int *)(in_RDI + 0xd0);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),(long)local_3c);
      *pvVar7 = -iVar5;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      std::vector<signed_char,_std::allocator<signed_char>_>::push_back
                ((vector<signed_char,_std::allocator<signed_char>_> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (value_type_conflict *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)(local_34 + 1));
    *pvVar7 = local_20;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1e0),(long)local_34);
    *pvVar7 = iVar2;
  }
  *(int *)(in_RDI + 0xb8) = (*(int *)(in_RDI + 200) - *(int *)(in_RDI + 0x1a8)) + local_20;
  *(double *)(in_RDI + 8) =
       *(double *)(in_RDI + 8) +
       (double)(local_20 * 0x3c + (*(int *)(in_RDI + 200) - *(int *)(in_RDI + 0x1a8)) * 0x50);
  local_70 = 0.0;
  sVar9 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0));
  auVar14._8_4_ = (int)(sVar9 >> 0x20);
  auVar14._0_8_ = sVar9;
  auVar14._12_4_ = 0x45300000;
  sVar10 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8));
  auVar15._8_4_ = (int)(sVar10 >> 0x20);
  auVar15._0_8_ = sVar10;
  auVar15._12_4_ = 0x45300000;
  iVar2 = *(int *)(in_RDI + 0x1a8);
  do {
    if (*(int *)(in_RDI + 0x1a8) < 1) break;
    iVar5 = *(int *)(in_RDI + 0x1a8);
    *(undefined4 *)(in_RDI + 0x1a8) = 0;
    for (local_90 = 0; local_90 < iVar5; local_90 = local_90 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1b0),(long)local_90);
      iVar6 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)iVar6);
      local_e8 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)(iVar6 + 1));
      iVar3 = *pvVar7;
      local_a0 = -1;
      bVar13 = false;
      local_a8 = 0;
      local_70 = (double)(iVar3 - local_e8) + local_70;
      for (local_ac = local_e8; local_ac < iVar3; local_ac = local_ac + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x210),(long)local_ac);
        iVar4 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),(long)iVar4);
        if (*pvVar7 == 1) {
          local_a0 = local_ac;
          bVar13 = true;
          break;
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),(long)iVar4);
        if (1 < *pvVar7) {
          local_a0 = local_ac;
          local_a8 = local_a8 + 1;
        }
      }
      if (bVar13) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x228),(long)local_a0);
        for (local_bc = 0; local_bc < 2; local_bc = local_bc + 1) {
          if (local_bc == 0) {
            local_1b0 = local_a0;
            local_c8 = local_e8;
          }
          else {
            local_c8 = local_a0 + 1;
            local_1b0 = iVar3;
          }
          for (; local_c8 < local_1b0; local_c8 = local_c8 + 1) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x210),(long)local_c8
                               );
            iVar4 = *pvVar7;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),(long)iVar4);
            if (*pvVar7 < 1) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                         (value_type_conflict2 *)
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
              std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x228),(long)local_c8)
              ;
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                         (value_type_conflict1 *)
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
            }
            else {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                         (value_type_conflict2 *)
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
              std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x228),(long)local_c8)
              ;
              std::vector<double,_std::allocator<double>_>::push_back
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         (value_type_conflict1 *)
                         CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
            }
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),(long)iVar4);
            *pvVar7 = *pvVar7 + -1;
          }
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x210),(long)local_a0);
        iVar3 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),(long)iVar3);
        *pvVar7 = 0;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x240),(long)iVar6);
        *pvVar7 = iVar3;
        std::vector<int,_std::allocator<int>_>::size
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x228),(long)local_a0);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        std::vector<int,_std::allocator<int>_>::size
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        std::vector<signed_char,_std::allocator<signed_char>_>::push_back
                  ((vector<signed_char,_std::allocator<signed_char>_> *)
                   CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (value_type_conflict *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      }
      else if (local_a8 == 1) {
        for (; local_ec = local_a0, local_e8 < local_a0; local_e8 = local_e8 + 1) {
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x210),(long)local_e8);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                     (value_type_conflict2 *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x228),(long)local_e8);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        }
        while (local_ec = local_ec + 1, local_ec < iVar3) {
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x210),(long)local_ec);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                     (value_type_conflict2 *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x228),(long)local_ec);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x210),(long)local_a0);
        iVar3 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),(long)iVar3);
        *pvVar7 = 0;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x240),(long)iVar6);
        *pvVar7 = iVar3;
        std::vector<int,_std::allocator<int>_>::size
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x228),(long)local_a0);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        std::vector<int,_std::allocator<int>_>::size
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        std::vector<signed_char,_std::allocator<signed_char>_>::push_back
                  ((vector<signed_char,_std::allocator<signed_char>_> *)
                   CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (value_type_conflict *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      }
      else {
        iVar3 = *(int *)(in_RDI + 0x1a8);
        *(int *)(in_RDI + 0x1a8) = iVar3 + 1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1b0),(long)iVar3);
        *pvVar7 = iVar6;
      }
    }
  } while (iVar5 != *(int *)(in_RDI + 0x1a8));
  sVar11 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0));
  count_00 = 0x43300000;
  index = 0x45300000;
  uVar19 = 0;
  uVar20 = 0;
  auVar16._8_4_ = (int)(sVar11 >> 0x20);
  auVar16._0_8_ = sVar11;
  auVar16._12_4_ = 0x45300000;
  dVar21 = 4503599627370496.0;
  this_00 = (HFactor *)0x4530000000000000;
  sVar12 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8));
  auVar17._8_4_ = (int)(sVar12 >> 0x20);
  auVar17._0_8_ = sVar12;
  auVar17._12_4_ = index;
  *(double *)(in_RDI + 8) =
       local_70 * 20.0 +
       (((double)iVar2 - (double)*(int *)(in_RDI + 0x1a8)) +
        (((auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0)) -
        ((auVar14._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)sVar9) - 4503599627370496.0))) +
       (((auVar17._8_8_ - (double)this_00) + ((double)CONCAT44(count_00,(int)sVar12) - dVar21)) -
       ((auVar15._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0)))) * 80.0 +
       *(double *)(in_RDI + 8);
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             (value_type_conflict2 *)0x7cae7c);
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             (value_type_conflict2 *)0x7caead);
  local_104 = 0;
  *(undefined4 *)(in_RDI + 0xc4) = 0;
  for (local_108 = 0; local_108 < *(int *)(in_RDI + 200); local_108 = local_108 + 1) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),(long)local_108);
    iVar2 = *pvVar7;
    if (0 < iVar2) {
      in_stack_fffffffffffffdb0 = local_104;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x318),(long)local_108);
      *pvVar7 = in_stack_fffffffffffffdb0;
      in_stack_fffffffffffffdb4 = iVar2 << 1;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x348),(long)local_108);
      *pvVar7 = in_stack_fffffffffffffdb4;
      local_104 = iVar2 * 2 + local_104;
      rlinkAdd((HFactor *)CONCAT44(uVar20,uVar19),index,count_00);
      *(int *)(in_RDI + 0xc4) = iVar2 + 1 + *(int *)(in_RDI + 0xc4);
    }
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar20,uVar19),CONCAT44(index,count_00));
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             (value_type_conflict2 *)0x7cb039);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x7cb05a);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x7cb06e);
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             (value_type_conflict2 *)0x7cb09d);
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             (value_type_conflict2 *)0x7cb0cc);
  local_120 = 0;
  for (local_124 = 0; local_124 < *(int *)(in_RDI + 0x1a8); local_124 = local_124 + 1) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1b0),(long)local_124);
    iVar2 = *pvVar7;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1e0),(long)iVar2);
    vVar18 = *pvVar7;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 600),(long)iVar2);
    *pvVar7 = vVar18;
    iVar5 = local_120;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),(long)iVar2);
    *pvVar7 = iVar5;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)(iVar2 + 1));
    vVar18 = *pvVar7;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)iVar2);
    iVar5 = (vVar18 - *pvVar7) * 2;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),(long)iVar2);
    *pvVar7 = iVar5;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),(long)iVar2);
    local_120 = *pvVar7 + local_120;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar20,uVar19),CONCAT44(index,count_00)
              );
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar20,uVar19),
               CONCAT44(index,count_00));
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)iVar2);
    local_12c = *pvVar7;
    while (iVar6 = local_12c,
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),
                              (long)(iVar2 + 1)), iVar6 < *pvVar7) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x210),(long)local_12c);
      iVar6 = *pvVar7;
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x228),(long)local_12c);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),(long)iVar6);
      if (*pvVar7 < 1) {
        colStoreN(this_00,(HighsInt)((ulong)dVar21 >> 0x20),SUB84(dVar21,0),
                  (double)CONCAT44(uVar20,uVar19));
      }
      else {
        colInsert((HFactor *)CONCAT44(uVar20,uVar19),index,count_00,
                  (double)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        rowInsert((HFactor *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),iVar5,
                  vVar18);
      }
      local_12c = local_12c + 1;
    }
    colFixMax(this_00,(HighsInt)((ulong)dVar21 >> 0x20));
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),(long)iVar2);
    clinkAdd((HFactor *)CONCAT44(uVar20,uVar19),index,count_00);
  }
  *(double *)(in_RDI + 8) =
       (double)((*(int *)(in_RDI + 200) + *(int *)(in_RDI + 0x1a8) + local_120) * 0x28 +
               local_104 * 0x14) + *(double *)(in_RDI + 8);
  *(undefined4 *)(in_RDI + 0xc0) = *(undefined4 *)(in_RDI + 0x1a8);
  return;
}

Assistant:

void HFactor::buildSimple() {
  /**
   * 0. Clear L and U factor
   */
  luClear();

  const bool progress_report = false;
  const HighsInt progress_frequency = 100000;

  // Set all values of permute to -1 so that unpermuted (rank
  // deficient) columns can be identified
  const HighsInt permute_dim = num_basic;
  // Strictly not necessary, but nice if it's the right size
  permute.resize(permute_dim);
  permute.assign(permute_dim, -1);

  /**
   * 1. Prepare basis matrix and deal with unit columns
   */
  const bool report_unit = false;
  const bool report_singletons = false;
  const bool report_markowitz = false;
  const bool report_anything =
      report_unit || report_singletons || report_markowitz;
  HighsInt BcountX = 0;
  fill_n(mr_count_before.data(), num_row, 0);
  nwork = 0;
  if (report_anything) printf("\nFactor\n");
  // Compile a vector iwork of the indices within basic_index of the
  // its nwork non-unit structural columns: they will be formed into
  // the B matrix as the kernel
  const HighsInt iwork_dim = num_basic;
  // Strictly not necessary, but nice if it's the right size
  iwork.resize(iwork_dim + 1, 0);
  iwork.assign(iwork_dim + 1, 0);
  for (HighsInt iCol = 0; iCol < num_basic; iCol++) {
    if (progress_report && iCol) {
      if (iCol % progress_frequency == 0)
        printf("HFactor::buildSimple stage = %6d\n", (int)iCol);
    }

    HighsInt iMat = basic_index[iCol];
    HighsInt iRow = -1;
    int8_t pivot_type = kPivotIllegal;
    // Look for unit columns as pivots. If there is already a pivot
    // corresponding to the nonzero in a unit column - evidenced by
    // mr_count_before[iRow] being negative - then, obviously, it
    // can't be used. However, it doesn't imply an error, or even rank
    // deficiency now that build() is being used to determine
    // rank. Treat it as a column to be handled in the kernel, so that
    // any rank deficiency or singularity is detected as late as
    // possible.
    if (iMat >= num_col) {
      // 1.1 Logical column
      //
      // Check for double pivot
      HighsInt lc_iRow = iMat - num_col;
      if (mr_count_before[lc_iRow] >= 0) {
        if (report_unit)
          printf("Stage %d: Logical\n", (int)(l_start.size() - 1));
        pivot_type = kPivotLogical;
        iRow = lc_iRow;
      } else {
        mr_count_before[lc_iRow]++;
        b_index[BcountX] = lc_iRow;
        b_value[BcountX++] = 1.0;
        iwork[nwork++] = iCol;
      }
    } else {
      // 1.2 Structural column
      HighsInt start = a_start[iMat];
      HighsInt count = a_start[iMat + 1] - start;
      // If this column and all subsequent columns are zero (so count
      // is 0) then a_index[start] and a_value[start] are unassigned,
      // so determine a unit column in two stages
      bool ok_unit_col = false;
      if (count == 1) {
        // Column has only one nonzero, but have to make sure that the
        // value is 1 and that there's not already a pivot
        // corresponding to this unit column
        ok_unit_col =
            a_value[start] == 1 && mr_count_before[a_index[start]] >= 0;
      }
      if (ok_unit_col) {
        if (report_unit) printf("Stage %d: Unit\n", (int)(l_start.size() - 1));
        // Don't exploit this special case in case the matrix is
        // re-factorized after scaling has been applied, making this
        // column non-unit.
        pivot_type = kPivotColSingleton;  //;kPivotUnit;//
        iRow = a_index[start];
      } else {
        for (HighsInt k = start; k < start + count; k++) {
          mr_count_before[a_index[k]]++;
          assert(BcountX < (HighsInt)b_index.size());
          b_index[BcountX] = a_index[k];
          b_value[BcountX++] = a_value[k];
        }
        iwork[nwork++] = iCol;
      }
    }

    if (iRow >= 0) {
      // 1.3 Record unit column
      permute[iCol] = iRow;
      l_start.push_back(l_index.size());
      u_pivot_index.push_back(iRow);
      u_pivot_value.push_back(1);
      u_start.push_back(u_index.size());
      // Was -num_row, but this is incorrect since the negation needs
      // to be great enough so that, starting from it, the accumulated
      // count can never reach zero
      mr_count_before[iRow] = -num_basic;
      assert(pivot_type != kPivotIllegal);
      this->refactor_info_.pivot_row.push_back(iRow);
      this->refactor_info_.pivot_var.push_back(iMat);
      this->refactor_info_.pivot_type.push_back(pivot_type);
    }
    b_start[iCol + 1] = BcountX;
    b_var[iCol] = iMat;
  }
  // Record the number of elements in the basis matrix
  basis_matrix_num_el = num_row - nwork + BcountX;

  // count1 = 0;
  // Comments: for pds-20, dfl001: 60 / 80
  // Comments: when system is large: enlarge
  // Comments: when system is small: decrease
  build_synthetic_tick += BcountX * 60 + (num_row - nwork) * 80;

  /**
   * 2. Search for and deal with singletons
   */
  double t2_search = 0;
  double t2_store_l = l_index.size();
  double t2_store_u = u_index.size();
  double t2_store_p = nwork;
  while (nwork > 0) {
    HighsInt nworkLast = nwork;
    nwork = 0;
    for (HighsInt i = 0; i < nworkLast; i++) {
      const HighsInt iCol = iwork[i];
      const HighsInt start = b_start[iCol];
      const HighsInt end = b_start[iCol + 1];
      HighsInt pivot_k = -1;
      HighsInt found_row_singleton = 0;
      HighsInt count = 0;

      // 2.1 Search for singleton
      t2_search += end - start;
      for (HighsInt k = start; k < end; k++) {
        const HighsInt iRow = b_index[k];
        if (mr_count_before[iRow] == 1) {
          pivot_k = k;
          found_row_singleton = 1;
          break;
        }
        if (mr_count_before[iRow] > 1) {
          pivot_k = k;
          count++;
        }
      }

      if (found_row_singleton) {
        // 2.2 Deal with row singleton
        const double pivot_multiplier = 1 / b_value[pivot_k];
        if (report_singletons)
          printf("Stage %d: Row singleton (%4d, %g)\n",
                 (int)(l_start.size() - 1), (int)pivot_k, pivot_multiplier);
        for (HighsInt section = 0; section < 2; section++) {
          HighsInt p0 = section == 0 ? start : pivot_k + 1;
          HighsInt p1 = section == 0 ? pivot_k : end;
          for (HighsInt k = p0; k < p1; k++) {
            HighsInt iRow = b_index[k];
            if (mr_count_before[iRow] > 0) {
              if (report_singletons)
                printf("Row singleton: L En (%4d, %11.4g)\n", (int)iRow,
                       b_value[k] * pivot_multiplier);
              l_index.push_back(iRow);
              l_value.push_back(b_value[k] * pivot_multiplier);
            } else {
              if (report_singletons)
                printf("Row singleton: U En (%4d, %11.4g)\n", (int)iRow,
                       b_value[k]);
              u_index.push_back(iRow);
              u_value.push_back(b_value[k]);
            }
            mr_count_before[iRow]--;
          }
        }
        HighsInt iRow = b_index[pivot_k];
        mr_count_before[iRow] = 0;
        permute[iCol] = iRow;
        l_start.push_back(l_index.size());

        if (report_singletons)
          printf("Row singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 b_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(b_value[pivot_k]);
        u_start.push_back(u_index.size());
        assert(b_var[iCol] == basic_index[iCol]);

        this->refactor_info_.pivot_row.push_back(iRow);
        this->refactor_info_.pivot_var.push_back(basic_index[iCol]);
        this->refactor_info_.pivot_type.push_back(kPivotRowSingleton);
      } else if (count == 1) {
        if (report_singletons)
          printf("Stage %d: Col singleton \n", (int)(l_start.size() - 1));
        // 2.3 Deal with column singleton
        for (HighsInt k = start; k < pivot_k; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)b_index[k],
                   b_value[k]);
          u_index.push_back(b_index[k]);
          u_value.push_back(b_value[k]);
        }
        for (HighsInt k = pivot_k + 1; k < end; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)b_index[k],
                   b_value[k]);
          u_index.push_back(b_index[k]);
          u_value.push_back(b_value[k]);
        }

        HighsInt iRow = b_index[pivot_k];
        mr_count_before[iRow] = 0;
        permute[iCol] = iRow;
        l_start.push_back(l_index.size());

        if (report_singletons)
          printf("Col singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 b_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(b_value[pivot_k]);
        u_start.push_back(u_index.size());
        assert(b_var[iCol] == basic_index[iCol]);
        this->refactor_info_.pivot_row.push_back(iRow);
        this->refactor_info_.pivot_var.push_back(basic_index[iCol]);
        this->refactor_info_.pivot_type.push_back(kPivotColSingleton);
      } else {
        iwork[nwork++] = iCol;
      }
    }

    // No singleton found in the last pass
    if (nworkLast == nwork) break;
  }
  if (report_anything) reportLu(kReportLuBoth, false);
  t2_store_l = static_cast<double>(l_index.size()) - t2_store_l;
  t2_store_u = static_cast<double>(u_index.size()) - t2_store_u;
  t2_store_p = t2_store_p - nwork;

  build_synthetic_tick +=
      t2_search * 20 + (t2_store_p + t2_store_l + t2_store_u) * 80;

  /**
   * 3. Prepare the kernel parts
   */
  // 3.1 Prepare row links, row matrix spaces
  row_link_first.assign(num_basic + 1, -1);
  mr_count.assign(num_row, 0);
  HighsInt mr_countX = 0;
  // Determine the number of entries in the kernel
  kernel_num_el = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt count = mr_count_before[iRow];
    if (count > 0) {
      mr_start[iRow] = mr_countX;
      mr_space[iRow] = count * 2;
      mr_countX += count * 2;
      rlinkAdd(iRow, count);
      kernel_num_el += count + 1;
    }
  }
  mr_index.resize(mr_countX);

  // 3.2 Prepare column links, kernel matrix
  col_link_first.assign(num_row + 1, -1);
  const HighsInt mc_dim = num_basic;
  mc_index.clear();
  mc_value.clear();
  mc_count_a.assign(mc_dim, 0);
  mc_count_n.assign(mc_dim, 0);
  HighsInt MCcountX = 0;
  for (HighsInt i = 0; i < nwork; i++) {
    HighsInt iCol = iwork[i];
    mc_var[iCol] = b_var[iCol];
    mc_start[iCol] = MCcountX;
    mc_space[iCol] = (b_start[iCol + 1] - b_start[iCol]) * 2;
    MCcountX += mc_space[iCol];
    mc_index.resize(MCcountX);
    mc_value.resize(MCcountX);
    for (HighsInt k = b_start[iCol]; k < b_start[iCol + 1]; k++) {
      const HighsInt iRow = b_index[k];
      const double value = b_value[k];
      if (mr_count_before[iRow] > 0) {
        colInsert(iCol, iRow, value);
        rowInsert(iCol, iRow);
      } else {
        colStoreN(iCol, iRow, value);
      }
    }
    colFixMax(iCol);
    clinkAdd(iCol, mc_count_a[iCol]);
  }
  build_synthetic_tick += (num_row + nwork + MCcountX) * 40 + mr_countX * 20;
  // Record the kernel dimension
  kernel_dim = nwork;
  assert((HighsInt)this->refactor_info_.pivot_row.size() == num_basic - nwork);
}